

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O1

void __thiscall re2c::DFA::calc_stats(DFA *this)

{
  ulong uVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  State *pSVar4;
  ulong uVar5;
  
  this->max_fill = 0;
  pSVar4 = this->head;
  if (pSVar4 != (State *)0x0) {
    uVar5 = 0;
    do {
      uVar1 = pSVar4->fill;
      if (uVar5 < uVar1) {
        this->max_fill = uVar1;
        uVar5 = uVar1;
      }
      pSVar4 = pSVar4->next;
    } while (pSVar4 != (State *)0x0);
  }
  ppSVar2 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar3 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this->need_backup = ppSVar2 != ppSVar3;
  for (pSVar4 = this->head; pSVar4 != (State *)0x0; pSVar4 = pSVar4->next) {
    if (pSVar4->isPreCtxt == true) {
      this->need_backupctx = true;
    }
  }
  this->need_accept = 8 < (ulong)((long)ppSVar2 - (long)ppSVar3);
  return;
}

Assistant:

void DFA::calc_stats ()
{
	// calculate 'YYMAXFILL'
	max_fill = 0;
	for (State * s = head; s; s = s->next)
	{
		if (max_fill < s->fill)
		{
			max_fill = s->fill;
		}
	}

	// determine if 'YYMARKER' or 'YYBACKUP'/'YYRESTORE' pair is used
	need_backup = accepts.size () > 0;

	// determine if 'YYCTXMARKER' or 'YYBACKUPCTX'/'YYRESTORECTX' pair is used
	for (State * s = head; s; s = s->next)
	{
		if (s->isPreCtxt)
		{
			need_backupctx = true;
		}
	}

	// determine if 'yyaccept' variable is used
	need_accept = accepts.size () > 1;
}